

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O3

string * kiste::parse_parent_class(string *__return_storage_ptr__,string *line)

{
  long lVar1;
  ulong uVar2;
  runtime_error *this;
  parse_error *this_00;
  
  lVar1 = std::__cxx11::string::find_first_not_of((char *)line,0x1090d6,0);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  if ((line->_M_dataplus)._M_p[lVar1] == ':') {
    uVar2 = std::__cxx11::string::find_first_not_of((char *)line,0x1090d6,lVar1 + 1);
    if (uVar2 != 0xffffffffffffffff) {
      uVar2 = std::__cxx11::string::find_first_of((char *)line,0x1090d6,uVar2);
      if (uVar2 == 0xffffffffffffffff) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)line);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)line);
      lVar1 = std::__cxx11::string::find_first_not_of((char *)line,0x1090d6,uVar2);
      if (lVar1 == -1) {
        return __return_storage_ptr__;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,"Unexpected trailing characters after parent class name");
      *(undefined ***)this = &PTR__runtime_error_0010cd88;
      __cxa_throw(this,&parse_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(this_00,"Could not find parent class name");
  }
  else {
    this_00 = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error
              (this_00,"Unexpected character after class name, did you forget a \':\'?");
  }
  __cxa_throw(this_00,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto parse_parent_class(const std::string& line) -> std::string
  {
    const auto colonPos = line.find_first_not_of(" \t");
    if (colonPos == line.npos)
    {
      return "";
    }
    if (line[colonPos] != ':')
    {
      throw parse_error("Unexpected character after class name, did you forget a ':'?");
    }
    const auto nameBegin = line.find_first_not_of(" \t", colonPos + 1);
    if (nameBegin == line.npos)
    {
      throw parse_error("Could not find parent class name");
    }
    const auto nameEnd = line.find_first_of(" \t", nameBegin);
    const auto parent_name = (nameEnd == line.npos) ? line.substr(nameBegin)
                                                    : line.substr(nameBegin, nameEnd - nameBegin);

    if (nameEnd != line.npos and line.find_first_not_of(" \t", nameEnd) != line.npos)
    {
      throw parse_error("Unexpected trailing characters after parent class name");
    }

    return parent_name;
  }